

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void alist_clone(t_alist *x,t_alist *y,int onset,int count)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  t_listelem *ptVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  y->l_pd = alist_class;
  y->l_n = count;
  y->l_npointer = 0;
  ptVar5 = (t_listelem *)getbytes((long)count * 0x28);
  y->l_vec = ptVar5;
  if (ptVar5 != (t_listelem *)0x0) {
    uVar3 = 0;
    if (0 < count) {
      uVar3 = count;
    }
    uVar7 = (ulong)uVar3;
    lVar6 = 0x10;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      puVar1 = (undefined8 *)((long)x->l_vec + lVar6 + -0x10 + (long)onset * 0x28);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)y->l_vec + lVar6 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      ptVar5 = y->l_vec;
      if (*(int *)((long)ptVar5 + lVar6 + -0x10) == 3) {
        gpointer_copy(*(t_gpointer **)((long)ptVar5 + lVar6 + -8),
                      (t_gpointer *)((long)&(ptVar5->l_a).a_type + lVar6));
        *(long *)((long)y->l_vec + lVar6 + -8) = (long)&(y->l_vec->l_a).a_type + lVar6;
        y->l_npointer = y->l_npointer + 1;
      }
      lVar6 = lVar6 + 0x28;
    }
    return;
  }
  y->l_n = 0;
  pd_error((void *)0x0,"list_alloc: out of memory");
  return;
}

Assistant:

static void alist_clone(t_alist *x, t_alist *y, int onset, int count)
{
    int i;
    y->l_pd = alist_class;
    y->l_n = count;
    y->l_npointer = 0;
    if (!(y->l_vec = (t_listelem *)getbytes(y->l_n * sizeof(*y->l_vec))))
    {
        y->l_n = 0;
        pd_error(0, "list_alloc: out of memory");
    }
    else for (i = 0; i < count; i++)
    {
        y->l_vec[i].l_a = x->l_vec[onset + i].l_a;
        if (y->l_vec[i].l_a.a_type == A_POINTER)
        {
            gpointer_copy(y->l_vec[i].l_a.a_w.w_gpointer, &y->l_vec[i].l_p);
            y->l_vec[i].l_a.a_w.w_gpointer = &y->l_vec[i].l_p;
            y->l_npointer++;
        }
    }
}